

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

IVal * deqp::gls::BuiltinPrecisionTests::
       ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doUnion
                 (IVal *a,IVal *b)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  bool bVar7;
  IVal *ret;
  IVal *in_RDI;
  long lVar8;
  undefined1 uVar9;
  ulong uVar10;
  ulong uVar11;
  
  lVar8 = 0;
  in_RDI->m_data[0].m_hasNaN = false;
  in_RDI->m_data[0].m_lo = INFINITY;
  in_RDI->m_data[0].m_hi = -INFINITY;
  in_RDI->m_data[1].m_hasNaN = false;
  in_RDI->m_data[1].m_lo = INFINITY;
  in_RDI->m_data[1].m_hi = -INFINITY;
  bVar6 = true;
  do {
    bVar7 = bVar6;
    uVar9 = true;
    if (a->m_data[lVar8].m_hasNaN == false) {
      uVar9 = (undefined1)*(undefined4 *)(b->m_data + lVar8);
    }
    in_RDI->m_data[lVar8].m_hasNaN = (bool)uVar9;
    pdVar1 = &a->m_data[lVar8].m_lo;
    dVar2 = *pdVar1;
    dVar3 = pdVar1[1];
    pdVar1 = &b->m_data[lVar8].m_lo;
    dVar4 = *pdVar1;
    dVar5 = pdVar1[1];
    uVar10 = -(ulong)(dVar2 <= dVar4);
    uVar11 = -(ulong)(dVar5 <= dVar3);
    pdVar1 = &in_RDI->m_data[lVar8].m_lo;
    *pdVar1 = (double)(~uVar10 & (ulong)dVar4 | (ulong)dVar2 & uVar10);
    pdVar1[1] = (double)(~uVar11 & (ulong)dVar5 | (ulong)dVar3 & uVar11);
    lVar8 = 1;
    bVar6 = false;
  } while (bVar7);
  return in_RDI;
}

Assistant:

static IVal			doUnion			(const IVal& a, const IVal& b)
	{
		IVal ret;

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			ret[ndx] = unionIVal<Element>(a[ndx], b[ndx]);

		return ret;
	}